

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O3

int google::SetVLOGLevel(char *module_pattern,int log_level)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t str_len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined8 *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  MutexLock local_40;
  MutexLock l;
  
  l.mu_._4_4_ = fLI::FLAGS_v;
  str_len = strlen(module_pattern);
  local_40.mu_ = (Mutex *)vmodule_lock;
  if ((vmodule_lock[0x38] == '\x01') &&
     (iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)vmodule_lock), iVar3 != 0)) {
    abort();
  }
  if (vmodule_list != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = false;
    pbVar5 = vmodule_list;
    do {
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(pbVar5,module_pattern);
      if (iVar3 == 0) {
        if (!bVar2) {
          l.mu_._4_4_ = *(int *)&pbVar5[1]._M_dataplus._M_p;
          bVar2 = true;
        }
        *(int *)&pbVar5[1]._M_dataplus._M_p = log_level;
      }
      else if ((!bVar2) &&
              (bVar1 = glog_internal_namespace_::SafeFNMatch_
                                 ((pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length,module_pattern
                                  ,str_len), bVar1)) {
        l.mu_._4_4_ = *(int *)&pbVar5[1]._M_dataplus._M_p;
        bVar2 = true;
      }
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               pbVar5[1]._M_string_length;
    } while (pbVar5 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (bVar2) goto LAB_0011f974;
  }
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x30);
  (this->_M_dataplus)._M_p = (pointer)&this->field_2;
  this->_M_string_length = 0;
  (this->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (this,module_pattern);
  puVar6 = cached_site_list;
  *(int *)&this[1]._M_dataplus._M_p = log_level;
  pbVar5 = this;
  this[1]._M_string_length = (size_type)vmodule_list;
  vmodule_list = pbVar5;
  if (puVar6 != (undefined8 *)0x0) {
    puVar4 = &cached_site_list;
    l.mu_._0_4_ = log_level;
    do {
      bVar2 = glog_internal_namespace_::SafeFNMatch_
                        (module_pattern,str_len,(char *)puVar6[1],puVar6[2]);
      if (bVar2) {
        *puVar6 = this + 1;
        puVar7 = (undefined8 *)puVar6[3];
        *puVar4 = puVar7;
      }
      else {
        puVar7 = (undefined8 *)puVar6[3];
        puVar4 = puVar6 + 3;
      }
      puVar6 = puVar7;
      log_level = (uint)l.mu_;
    } while (puVar7 != (undefined8 *)0x0);
  }
LAB_0011f974:
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_40);
  if (SetVLOGLevel::vlocal__.level == (int32 *)0x0) {
    bVar2 = InitVLOG3__(&SetVLOGLevel::vlocal__,&fLI::FLAGS_v,
                        "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/vlog_is_on.cc"
                        ,1);
    if (!bVar2) {
      return l.mu_._4_4_;
    }
  }
  else if (*SetVLOGLevel::vlocal__.level < 1) {
    return l.mu_._4_4_;
  }
  RawLog__(0,
           "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/vlog_is_on.cc"
           ,0xd6,"Set VLOG level for \"%s\" to %d",module_pattern,(ulong)(uint)log_level);
  return l.mu_._4_4_;
}

Assistant:

int SetVLOGLevel(const char* module_pattern, int log_level) {
  int result = FLAGS_v;
  size_t const pattern_len = strlen(module_pattern);
  bool found = false;
  {
    MutexLock l(&vmodule_lock);  // protect whole read-modify-write
    for (const VModuleInfo* info = vmodule_list;
         info != NULL; info = info->next) {
      if (info->module_pattern == module_pattern) {
        if (!found) {
          result = info->vlog_level;
          found = true;
        }
        info->vlog_level = log_level;
      } else if (!found  &&
                 SafeFNMatch_(info->module_pattern.c_str(),
                              info->module_pattern.size(),
                              module_pattern, pattern_len)) {
        result = info->vlog_level;
        found = true;
      }
    }
    if (!found) {
      VModuleInfo* info = new VModuleInfo;
      info->module_pattern = module_pattern;
      info->vlog_level = log_level;
      info->next = vmodule_list;
      vmodule_list = info;

      SiteFlag** item_ptr = &cached_site_list;
      SiteFlag* item = cached_site_list;

      // We traverse the list fully because the pattern can match several items
      // from the list.
      while (item) {
        if (SafeFNMatch_(module_pattern, pattern_len, item->base_name,
                         item->base_len)) {
          // Redirect the cached value to its module override.
          item->level = &info->vlog_level;
          *item_ptr = item->next;  // Remove the item from the list.
        } else {
          item_ptr = &item->next;
        }
        item = *item_ptr;
      }
    }
  }
  RAW_VLOG(1, "Set VLOG level for \"%s\" to %d", module_pattern, log_level);
  return result;
}